

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

IdWithExprCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IdWithExprCoverageBinInitializerSyntax,slang::syntax::IdWithExprCoverageBinInitializerSyntax_const&>
          (BumpAllocator *this,IdWithExprCoverageBinInitializerSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  WithClauseSyntax *pWVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  IdWithExprCoverageBinInitializerSyntax *pIVar10;
  
  pIVar10 = (IdWithExprCoverageBinInitializerSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IdWithExprCoverageBinInitializerSyntax *)this->endPtr < pIVar10 + 1) {
    pIVar10 = (IdWithExprCoverageBinInitializerSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pIVar10 + 1);
  }
  SVar8 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_CoverageBinInitializerSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->id).kind;
  uVar5 = (args->id).field_0x2;
  NVar6.raw = (args->id).numFlags.raw;
  uVar7 = (args->id).rawLen;
  pWVar3 = (args->withClause).ptr;
  (pIVar10->id).info = (args->id).info;
  (pIVar10->withClause).ptr = pWVar3;
  (pIVar10->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pIVar10->id).kind = TVar4;
  (pIVar10->id).field_0x2 = uVar5;
  (pIVar10->id).numFlags = (NumericTokenFlags)NVar6.raw;
  (pIVar10->id).rawLen = uVar7;
  (pIVar10->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pIVar10->super_CoverageBinInitializerSyntax).super_SyntaxNode.field_0x4 = uVar9;
  (pIVar10->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent = pSVar1;
  return pIVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }